

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O0

int lj_cf_table_insert(lua_State *L)

{
  MSize MVar1;
  int iVar2;
  uint uVar3;
  GCtab *t_00;
  TValue *pTVar4;
  long in_RDI;
  TValue *dst_1;
  cTValue *src;
  TValue *dst;
  int nargs;
  int32_t i;
  int32_t n;
  GCtab *t;
  GCobj *o;
  undefined8 in_stack_ffffffffffffff68;
  ErrMsg em;
  lua_State *in_stack_ffffffffffffff70;
  TValue *in_stack_ffffffffffffff78;
  GCtab *in_stack_ffffffffffffff80;
  cTValue *in_stack_ffffffffffffff88;
  uint local_60;
  
  em = (ErrMsg)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  t_00 = lj_lib_checktab(in_stack_ffffffffffffff70,em);
  MVar1 = lj_tab_len((GCtab *)&in_stack_ffffffffffffff78->field_2);
  local_60 = MVar1 + 1;
  iVar2 = (int)*(undefined8 *)(in_RDI + 0x18) - (int)*(undefined8 *)(in_RDI + 0x10);
  uVar3 = local_60;
  if (iVar2 != 0x10) {
    if (iVar2 != 0x18) {
      lj_err_caller(in_stack_ffffffffffffff70,em);
    }
    uVar3 = lj_lib_checkint((lua_State *)&in_stack_ffffffffffffff78->field_2,
                            (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    for (; (int)uVar3 < (int)local_60; local_60 = local_60 - 1) {
      if (local_60 < t_00->asize) {
        pTVar4 = (TValue *)((ulong)(t_00->array).ptr32 + (long)(int)local_60 * 8);
      }
      else {
        pTVar4 = lj_tab_setinth((lua_State *)&in_stack_ffffffffffffff88->field_2,
                                in_stack_ffffffffffffff80,
                                (int32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      }
      in_stack_ffffffffffffff78 = pTVar4;
      if (local_60 - 1 < t_00->asize) {
        in_stack_ffffffffffffff88 =
             (cTValue *)((ulong)(t_00->array).ptr32 + (long)(int)(local_60 - 1) * 8);
      }
      else {
        in_stack_ffffffffffffff88 = lj_tab_getinth(t_00,local_60 - 1);
      }
      if (in_stack_ffffffffffffff88 == (cTValue *)0x0) {
        (pTVar4->field_2).it = 0xffffffff;
      }
      else {
        pTVar4->field_2 = *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)in_stack_ffffffffffffff88;
      }
    }
  }
  local_60 = uVar3;
  if (local_60 < t_00->asize) {
    pTVar4 = (TValue *)((ulong)(t_00->array).ptr32 + (long)(int)local_60 * 8);
  }
  else {
    pTVar4 = lj_tab_setinth((lua_State *)&in_stack_ffffffffffffff88->field_2,
                            in_stack_ffffffffffffff80,
                            (int32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  }
  *pTVar4 = *(TValue *)(*(long *)(in_RDI + 0x18) + -8);
  if (((0xfffffff6 < (pTVar4->field_2).it + 4) &&
      ((*(byte *)((ulong)(pTVar4->u32).lo + 4) & 3) != 0)) && ((t_00->marked & 4) != 0)) {
    uVar3 = *(uint *)(in_RDI + 8);
    t_00->marked = t_00->marked & 0xfb;
    (t_00->gclist).gcptr32 = *(uint32_t *)((ulong)uVar3 + 0x3c);
    *(int *)((ulong)uVar3 + 0x3c) = (int)t_00;
  }
  return 0;
}

Assistant:

LJLIB_CF(table_insert)		LJLIB_REC(.)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n, i = (int32_t)lj_tab_len(t) + 1;
  int nargs = (int)((char *)L->top - (char *)L->base);
  if (nargs != 2*sizeof(TValue)) {
    if (nargs != 3*sizeof(TValue))
      lj_err_caller(L, LJ_ERR_TABINS);
    /* NOBARRIER: This just moves existing elements around. */
    for (n = lj_lib_checkint(L, 2); i > n; i--) {
      /* The set may invalidate the get pointer, so need to do it first! */
      TValue *dst = lj_tab_setint(L, t, i);
      cTValue *src = lj_tab_getint(t, i-1);
      if (src) {
	copyTV(L, dst, src);
      } else {
	setnilV(dst);
      }
    }
    i = n;
  }
  {
    TValue *dst = lj_tab_setint(L, t, i);
    copyTV(L, dst, L->top-1);  /* Set new value. */
    lj_gc_barriert(L, t, dst);
  }
  return 0;
}